

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

SchnorrPubkey *
cfd::core::SchnorrPubkey::FromPubkey
          (SchnorrPubkey *__return_storage_ptr__,Pubkey *pubkey,bool *parity)

{
  secp256k1_xonly_pubkey xpk;
  void *local_a0 [8];
  secp256k1_xonly_pubkey local_60;
  
  ParsePubkey((secp256k1_pubkey_conflict *)local_a0,pubkey);
  GetXOnlyPubkeyFromPubkey(&local_60,(secp256k1_pubkey_conflict *)local_a0,parity);
  ConvertSchnorrPubkey((ByteData256 *)local_a0,&local_60);
  SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)local_a0);
  if ((pointer)local_a0[0] != (pointer)0x0) {
    operator_delete(local_a0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::FromPubkey(const Pubkey &pubkey, bool *parity) {
  auto xpk = GetXOnlyPubkeyFromPubkey(ParsePubkey(pubkey), parity);
  return SchnorrPubkey(ConvertSchnorrPubkey(xpk));
}